

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int experimental_arenas_i_pactivep_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long in_RAX;
  void *pvVar4;
  size_t __n;
  size_t *pactivep;
  long local_38;
  
  iVar2 = 0x16;
  if ((oldlenp != (size_t *)0x0 && oldp != (void *)0x0) && (*oldlenp == 8)) {
    local_38 = in_RAX;
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
    if (iVar2 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&ctl_mtx);
      ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
    }
    ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
    if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
      ctl_mtx.field_0.witness.link.qre_prev =
           (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
      ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    }
    iVar2 = 1;
    if (newp == (void *)0x0 && newlen == 0) {
      uVar1 = mib[2];
      iVar2 = 0xe;
      if (uVar1 >> 0x20 == 0) {
        uVar3 = duckdb_je_narenas_total_get();
        if ((uint)uVar1 < uVar3) {
          pvVar4 = duckdb_je_arenas[uVar1].repr;
          if (pvVar4 == (void *)0x0) {
            pvVar4 = (void *)0x0;
          }
          if (pvVar4 != (void *)0x0) {
            local_38 = (long)pvVar4 + 0x29b0;
            uVar1 = *oldlenp;
            if (uVar1 == 8) {
              *(long *)oldp = local_38;
              iVar2 = 0;
            }
            else {
              __n = 8;
              if (uVar1 < 8) {
                __n = uVar1;
              }
              switchD_015ff80e::default(oldp,&local_38,__n);
              *oldlenp = __n;
              iVar2 = 0x16;
            }
          }
        }
      }
    }
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  }
  return iVar2;
}

Assistant:

static int
experimental_arenas_i_pactivep_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}
	if (oldp == NULL || oldlenp == NULL || *oldlenp != sizeof(size_t *)) {
		return EINVAL;
	}

	unsigned arena_ind;
	arena_t *arena;
	int ret;
	size_t *pactivep;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	MIB_UNSIGNED(arena_ind, 2);
	if (arena_ind < narenas_total_get() && (arena =
	    arena_get(tsd_tsdn(tsd), arena_ind, false)) != NULL) {
#if defined(JEMALLOC_GCC_ATOMIC_ATOMICS) ||				\
    defined(JEMALLOC_GCC_SYNC_ATOMICS) || defined(_MSC_VER)
		/* Expose the underlying counter for fast read. */
		pactivep = (size_t *)&(arena->pa_shard.nactive.repr);
		READ(pactivep, size_t *);
		ret = 0;
#else
		ret = EFAULT;
#endif
	} else {
		ret = EFAULT;
	}
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}